

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

size_t anon_unknown.dwarf_a27195::cmWriteToFileCallback
                 (void *ptr,size_t size,size_t nmemb,void *data)

{
  if (data != (void *)0x0) {
    std::ostream::write((char *)data,(long)ptr);
  }
  return (long)((int)size * (int)nmemb);
}

Assistant:

size_t cmWriteToFileCallback(void* ptr, size_t size, size_t nmemb, void* data)
{
  int realsize = static_cast<int>(size * nmemb);
  cmsys::ofstream* fout = static_cast<cmsys::ofstream*>(data);
  if (fout) {
    const char* chPtr = static_cast<char*>(ptr);
    fout->write(chPtr, realsize);
  }
  return realsize;
}